

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::makePitchBend(MidiMessage *this,int channel,int lsb,int msb)

{
  byte local_1f;
  byte local_1e;
  byte local_1d;
  int local_1c;
  int local_18;
  int msb_local;
  int lsb_local;
  int channel_local;
  MidiMessage *this_local;
  
  local_1c = msb;
  local_18 = lsb;
  msb_local = channel;
  _lsb_local = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  local_1d = (byte)msb_local & 0xe | 0xe0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1d);
  local_1e = (byte)local_18 & 0x7f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1e);
  local_1f = (byte)local_1c & 0x7f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1f);
  return;
}

Assistant:

void MidiMessage::makePitchBend(int channel, int lsb, int msb) {
	resize(0);
	push_back(0xe0 | (0x0e & channel));
	push_back(0x7f & lsb);
	push_back(0x7f & msb);
}